

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testaniminter.cpp
# Opt level: O1

int plus_or_minus_proc(Am_Object *self)

{
  Am_Value *value;
  Am_Input_Char ic;
  Am_Object inter;
  Am_Input_Char local_14;
  Am_Object local_10;
  
  Am_Object::Get_Object((ushort)&local_10,(ulong)self);
  value = (Am_Value *)Am_Object::Get((ushort)&local_10,0x11b);
  Am_Input_Char::Am_Input_Char(&local_14,value);
  Am_Object::~Am_Object(&local_10);
  return (uint)(local_14.code != 0x100) * 0x10 + -8;
}

Assistant:

Am_Define_Formula(int, plus_or_minus)
{
  Am_Object inter = self.Get_Owner();
  Am_Input_Char ic = inter.Get(Am_START_CHAR);
  if (ic.code == Am_LEFT_MOUSE)
    return -8;
  return 8;
}